

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UVector::indexOf(UVector *this,UElement key,int32_t startIndex,int8_t hint)

{
  UBool UVar1;
  int local_2c;
  int32_t i;
  int8_t hint_local;
  int32_t startIndex_local;
  UVector *this_local;
  UElement key_local;
  
  local_2c = startIndex;
  if (this->comparer == (UElementsAreEqual *)0x0) {
    for (; local_2c < this->count; local_2c = local_2c + 1) {
      if ((hint & 1U) == 0) {
        this_local._0_4_ = key.integer;
        if ((int)this_local == this->elements[local_2c].integer) {
          return local_2c;
        }
      }
      else if (key.pointer == this->elements[local_2c].pointer) {
        return local_2c;
      }
    }
  }
  else {
    for (; local_2c < this->count; local_2c = local_2c + 1) {
      UVar1 = (*this->comparer)((UElement)key.pointer,(UElement)this->elements[local_2c].pointer);
      if (UVar1 != '\0') {
        return local_2c;
      }
    }
  }
  return -1;
}

Assistant:

int32_t UVector::indexOf(UElement key, int32_t startIndex, int8_t hint) const {
    int32_t i;
    if (comparer != 0) {
        for (i=startIndex; i<count; ++i) {
            if ((*comparer)(key, elements[i])) {
                return i;
            }
        }
    } else {
        for (i=startIndex; i<count; ++i) {
            /* Pointers are not always the same size as ints so to perform
             * a valid comparision we need to know whether we are being
             * provided an int or a pointer. */
            if (hint & HINT_KEY_POINTER) {
                if (key.pointer == elements[i].pointer) {
                    return i;
                }
            } else {
                if (key.integer == elements[i].integer) {
                    return i;
                }
            }
        }
    }
    return -1;
}